

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int lyp_check_date(ly_ctx *ctx,char *date)

{
  ushort **ppuVar1;
  char *pcVar2;
  long lVar3;
  undefined1 local_98 [8];
  tm tm_;
  undefined1 auStack_58 [8];
  tm tm;
  
  if (date == (char *)0x0) {
    __assert_fail("date",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0x989,"int lyp_check_date(struct ly_ctx *, const char *)");
  }
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
    if (((int)lVar3 == 7) || ((int)lVar3 == 4)) {
      if (date[lVar3] != '-') goto LAB_00125de2;
    }
    else {
      ppuVar1 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar1 + (long)date[lVar3] * 2 + 1) & 8) == 0) goto LAB_00125de2;
    }
  }
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  auStack_58._0_4_ = 0;
  auStack_58._4_4_ = 0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_gmtoff = 0;
  pcVar2 = strptime(date,"%Y-%m-%d",(tm *)auStack_58);
  if (pcVar2 == date + 10 && pcVar2 != (char *)0x0) {
    tm.tm_sec = 0xc;
    tm_.tm_hour = tm.tm_hour;
    tm_.tm_mday = tm.tm_mday;
    tm_.tm_mon = tm.tm_mon;
    tm_.tm_year = tm.tm_year;
    tm_.tm_wday = tm.tm_wday;
    tm_.tm_yday = tm.tm_yday;
    tm_.tm_isdst = tm.tm_isdst;
    tm_._36_4_ = tm._36_4_;
    tm_.tm_gmtoff = tm.tm_gmtoff;
    local_98 = auStack_58;
    tm_.tm_sec = 0xc;
    tm_.tm_min = tm.tm_min;
    mktime((tm *)local_98);
    if (tm.tm_min == tm_.tm_min) {
      return 0;
    }
  }
LAB_00125de2:
  ly_vlog(ctx,LYE_INDATE,LY_VLOG_NONE,(void *)0x0,date);
  return 1;
}

Assistant:

int
lyp_check_date(struct ly_ctx *ctx, const char *date)
{
    int i;
    struct tm tm, tm_;
    char *r;

    assert(date);

    /* check format */
    for (i = 0; i < LY_REV_SIZE - 1; i++) {
        if (i == 4 || i == 7) {
            if (date[i] != '-') {
                goto error;
            }
        } else if (!isdigit(date[i])) {
            goto error;
        }
    }

    /* check content, e.g. 2018-02-31 */
    memset(&tm, 0, sizeof tm);
    r = strptime(date, "%Y-%m-%d", &tm);
    if (!r || r != &date[LY_REV_SIZE - 1]) {
        goto error;
    }
    /* set some arbitrary non-0 value in case DST changes, it could move the day otherwise */
    tm.tm_hour = 12;

    memcpy(&tm_, &tm, sizeof tm);
    mktime(&tm_); /* mktime modifies tm_ if it refers invalid date */
    if (tm.tm_mday != tm_.tm_mday) { /* e.g 2018-02-29 -> 2018-03-01 */
        /* checking days is enough, since other errors
         * have been checked by strptime() */
        goto error;
    }

    return EXIT_SUCCESS;

error:
    LOGVAL(ctx, LYE_INDATE, LY_VLOG_NONE, NULL, date);
    return EXIT_FAILURE;
}